

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int Fax3Decode1D(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  uint *puVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  uint *local_68;
  long local_38;
  
  puVar5 = tif->tif_data;
  if (occ % *(long *)(puVar5 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax3Decode1D","Fractional scanlines cannot be read");
    return -1;
  }
  uVar22 = *(uint *)(puVar5 + 0x48);
  iVar24 = *(int *)(puVar5 + 0x4c);
  iVar25 = *(int *)(puVar5 + 0x50);
  pbVar18 = tif->tif_rawcp;
  lVar19 = tif->tif_rawcc;
  pbVar17 = pbVar18;
  if (0 < occ) {
    uVar3 = *(uint *)(puVar5 + 0x10);
    uVar14 = (ulong)uVar3;
    lVar6 = *(long *)(puVar5 + 0x40);
    pbVar18 = pbVar18 + lVar19;
    puVar7 = *(uint **)(puVar5 + 0x78);
    local_38 = occ;
LAB_0029984a:
    pbVar16 = pbVar17;
    local_68 = puVar7;
    if (iVar25 == 0) {
      while( true ) {
        pbVar16 = pbVar17;
        iVar26 = iVar24;
        if (iVar24 < 0xb) {
          if (pbVar17 < pbVar18) {
            pbVar16 = pbVar17 + 1;
            uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar17) << ((byte)iVar24 & 0x1f);
            iVar26 = iVar24 + 8;
            if (iVar24 < 3) {
              if (pbVar16 < pbVar18) {
                uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar17[1]) <<
                                  ((byte)(iVar24 + 8) & 0x1f);
                pbVar16 = pbVar17 + 2;
                iVar26 = iVar24 + 0x10;
              }
              else {
                iVar26 = 0xb;
              }
            }
          }
          else {
            if (iVar24 == 0) {
              iVar25 = 0;
              goto LAB_00299dc5;
            }
            iVar26 = 0xb;
          }
        }
        iVar24 = iVar26;
        if ((uVar22 & 0x7ff) == 0) break;
        iVar24 = iVar24 + -1;
        uVar22 = uVar22 >> 1;
        pbVar17 = pbVar16;
      }
    }
    while( true ) {
      pbVar17 = pbVar16;
      if (iVar24 < 8) {
        if (pbVar16 < pbVar18) {
          uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar16) << ((byte)iVar24 & 0x1f);
          iVar24 = iVar24 + 8;
          pbVar17 = pbVar16 + 1;
        }
        else {
          bVar27 = iVar24 == 0;
          iVar24 = 8;
          if (bVar27) goto LAB_00299dc5;
        }
      }
      if ((char)uVar22 != '\0') break;
      iVar24 = iVar24 + -8;
      uVar22 = uVar22 >> 8;
      pbVar16 = pbVar17;
    }
    uVar15 = uVar22 & 1;
    while (uVar15 == 0) {
      iVar24 = iVar24 + -1;
      uVar15 = uVar22 & 2;
      uVar22 = uVar22 >> 1;
    }
    iVar24 = iVar24 + -1;
    uVar22 = uVar22 >> 1;
    uVar21 = 0;
LAB_00299934:
    uVar15 = 0;
    pbVar16 = pbVar17;
    do {
      pbVar17 = pbVar16;
      iVar25 = iVar24;
      puVar23 = local_68;
      if (iVar24 < 0xc) {
        if (pbVar16 < pbVar18) {
          pbVar17 = pbVar16 + 1;
          uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar16) << ((byte)iVar24 & 0x1f);
          iVar25 = iVar24 + 8;
          if (iVar24 < 4) {
            if (pbVar17 < pbVar18) {
              uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar16[1]) << ((byte)iVar25 & 0x1f);
              iVar25 = iVar24 + 0x10;
              pbVar17 = pbVar16 + 2;
            }
            else {
              iVar25 = 0xc;
            }
          }
        }
        else {
          iVar25 = 0xc;
          if (iVar24 == 0) goto LAB_00299ec2;
        }
      }
      uVar9 = uVar22 & 0xfff;
      uVar22 = uVar22 >> (TIFFFaxWhiteTable[uVar9].Width & 0x1f);
      iVar24 = iVar25 - (uint)TIFFFaxWhiteTable[uVar9].Width;
      pbVar16 = pbVar17;
      switch(TIFFFaxWhiteTable[uVar9].State) {
      case '\a':
        goto switchD_002999c5_caseD_7;
      default:
        goto LAB_00299b15;
      case '\t':
      case '\v':
        uVar21 = (ulong)((int)uVar21 + TIFFFaxWhiteTable[uVar9].Param);
        uVar15 = uVar15 + TIFFFaxWhiteTable[uVar9].Param;
        break;
      case '\f':
        iVar25 = 1;
        goto LAB_00299b85;
      }
    } while( true );
  }
LAB_00299d99:
  *(int *)(puVar5 + 0x4c) = iVar24;
  *(uint *)(puVar5 + 0x48) = uVar22;
  *(int *)(puVar5 + 0x50) = iVar25;
  tif->tif_rawcc = (tmsize_t)(pbVar18 + (lVar19 - (long)pbVar17));
  tif->tif_rawcp = pbVar17;
  return 1;
LAB_00299dc5:
  if (uVar3 == 0) goto LAB_0029a17a;
  pcVar20 = "tile";
  puVar12 = &tif->tif_curtile;
  if ((tif->tif_flags >> 10 & 1) == 0) {
    pcVar20 = "strip";
    puVar12 = &tif->tif_curstrip;
  }
  TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)","Premature EOL",
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar20,(ulong)*puVar12,0,uVar14);
  if ((int)uVar3 < 1) {
    if ((*(int *)(puVar5 + 0x68) != 0) && (*puVar7 = uVar3, 1 < *(uint *)(puVar5 + 0x68))) {
      puVar7[1] = 0;
      local_68 = puVar7 + 2;
      goto LAB_0029a17a;
    }
  }
  else if (*(int *)(puVar5 + 0x68) != 0) {
    *puVar7 = uVar3;
    local_68 = puVar7 + 1;
    goto LAB_0029a17a;
  }
  bVar27 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar20 = "tile";
  if (bVar27) {
    pcVar20 = "strip";
  }
  uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
  puVar12 = &tif->tif_curtile;
  if (bVar27) {
    puVar12 = &tif->tif_curstrip;
  }
  uVar21 = (ulong)*puVar12;
  goto LAB_0029a232;
switchD_002999c5_caseD_7:
  if (local_68 < puVar7 + *(uint *)(puVar5 + 0x68)) {
    uVar4 = TIFFFaxWhiteTable[uVar9].Param;
    uVar9 = uVar15 + uVar4;
    puVar23 = local_68 + 1;
    *local_68 = uVar9;
    uVar15 = (int)uVar21 + uVar4;
    uVar21 = (ulong)uVar15;
    if ((int)uVar3 <= (int)uVar15) goto LAB_00299d8f;
    uVar15 = 0;
    while( true ) {
      pbVar17 = pbVar16;
      iVar25 = iVar24;
      if (iVar24 < 0xd) {
        if (pbVar16 < pbVar18) {
          pbVar17 = pbVar16 + 1;
          uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)*pbVar16) << ((byte)iVar24 & 0x1f);
          iVar25 = iVar24 + 8;
          if (iVar24 < 5) {
            if (pbVar17 < pbVar18) {
              uVar22 = uVar22 | (uint)*(byte *)(lVar6 + (ulong)pbVar16[1]) << ((byte)iVar25 & 0x1f);
              iVar25 = iVar24 + 0x10;
              pbVar17 = pbVar16 + 2;
            }
            else {
              iVar25 = 0xd;
            }
          }
        }
        else {
          iVar25 = 0xd;
          if (iVar24 == 0) goto LAB_00299ec2;
        }
      }
      uVar10 = uVar22 & 0x1fff;
      uVar22 = uVar22 >> (TIFFFaxBlackTable[uVar10].Width & 0x1f);
      iVar24 = iVar25 - (uint)TIFFFaxBlackTable[uVar10].Width;
      bVar2 = TIFFFaxBlackTable[uVar10].State;
      if (1 < bVar2 - 10) break;
      uVar21 = (ulong)((int)uVar21 + TIFFFaxBlackTable[uVar10].Param);
      uVar15 = uVar15 + TIFFFaxBlackTable[uVar10].Param;
      pbVar16 = pbVar17;
    }
    if (bVar2 == 0xc) {
      iVar25 = 1;
    }
    else {
      if (bVar2 == 8) {
        if (puVar23 < puVar7 + *(uint *)(puVar5 + 0x68)) {
          uVar4 = TIFFFaxBlackTable[uVar10].Param;
          uVar15 = uVar15 + uVar4;
          puVar23 = local_68 + 2;
          local_68[1] = uVar15;
          uVar10 = (int)uVar21 + uVar4;
          uVar21 = (ulong)uVar10;
          if ((int)uVar3 <= (int)uVar10) goto LAB_00299d8f;
          if (uVar15 != 0 || uVar9 != 0) {
            local_68 = puVar23;
          }
          goto LAB_00299934;
        }
        goto LAB_0029a065;
      }
LAB_00299b15:
      bVar27 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar20 = "tile";
      if (bVar27) {
        pcVar20 = "strip";
      }
      puVar12 = &tif->tif_curtile;
      if (bVar27) {
        puVar12 = &tif->tif_curstrip;
      }
      iVar25 = 0;
      TIFFErrorExtR(tif,"Fax3Decode1D","Bad code word at line %u of %s %u (x %u)",
                    (ulong)*(uint *)(puVar5 + 0x98),pcVar20,(ulong)*puVar12,uVar21);
    }
LAB_00299b85:
    if (uVar15 == 0) goto LAB_00299bb3;
    if (puVar23 < puVar7 + *(uint *)(puVar5 + 0x68)) {
      *puVar23 = uVar15;
      puVar23 = puVar23 + 1;
      goto LAB_00299bb3;
    }
  }
LAB_0029a065:
  uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
  bVar27 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar20 = "tile";
  if (bVar27) {
    pcVar20 = "strip";
  }
  puVar12 = &tif->tif_curtile;
  if (bVar27) {
    puVar12 = &tif->tif_curstrip;
  }
  goto LAB_0029a221;
LAB_00299ec2:
  local_68 = puVar23;
  puVar12 = &tif->tif_curtile;
  puVar1 = &tif->tif_curstrip;
  pcVar20 = "tile";
  puVar11 = puVar12;
  if ((tif->tif_flags >> 10 & 1) == 0) {
    pcVar20 = "strip";
    puVar11 = puVar1;
  }
  TIFFWarningExtR(tif,"Fax3Decode1D","Premature EOF at line %u of %s %u (x %u)",
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar20,(ulong)*puVar11,uVar21);
  if (uVar15 != 0) {
    if (puVar7 + *(uint *)(puVar5 + 0x68) <= local_68) {
      bVar27 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar20 = "tile";
      if (bVar27) {
        pcVar20 = "strip";
      }
      uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
      if (bVar27) {
        puVar12 = puVar1;
      }
      uVar22 = *puVar12;
      goto LAB_0029a224;
    }
    *local_68 = uVar15;
    local_68 = local_68 + 1;
  }
  uVar15 = (uint)uVar21;
  if (uVar15 == uVar3) goto LAB_0029a175;
  bVar27 = (tif->tif_flags >> 10 & 1) == 0;
  pcVar20 = "tile";
  if (bVar27) {
    pcVar20 = "strip";
  }
  puVar11 = puVar12;
  if (bVar27) {
    puVar11 = puVar1;
  }
  pcVar13 = "Line length mismatch";
  if (uVar15 < uVar3) {
    pcVar13 = "Premature EOL";
  }
  TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                  (ulong)*(uint *)(puVar5 + 0x98),pcVar20,(ulong)*puVar11,uVar21,uVar14);
  bVar27 = (int)uVar3 < (int)uVar15;
  if (((int)uVar15 <= (int)uVar3) || (local_68 <= puVar7)) goto LAB_0029a0c1;
  goto LAB_0029a012;
LAB_00299d8f:
  iVar25 = 0;
LAB_00299bb3:
  uVar15 = (uint)uVar21;
  if (uVar15 != uVar3) {
    puVar12 = &tif->tif_curtile;
    puVar1 = &tif->tif_curstrip;
    pcVar20 = "tile";
    puVar11 = puVar12;
    if ((tif->tif_flags >> 10 & 1) == 0) {
      pcVar20 = "strip";
      puVar11 = puVar1;
    }
    pcVar13 = "Line length mismatch";
    if (uVar15 < uVar3) {
      pcVar13 = "Premature EOL";
    }
    TIFFWarningExtR(tif,"Fax3Decode1D","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                    (ulong)*(uint *)(puVar5 + 0x98),pcVar20,(ulong)*puVar11,uVar21,uVar14);
    while( true ) {
      iVar26 = (int)uVar21;
      if (((int)uVar15 <= (int)uVar3) || (puVar23 <= puVar7)) break;
      puVar23 = puVar23 + -1;
      uVar15 = iVar26 - *puVar23;
      uVar21 = (ulong)uVar15;
    }
    if ((int)uVar3 <= iVar26) {
      if ((int)uVar3 < (int)uVar15) {
        if ((puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) ||
           (*puVar23 = uVar3, puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23 + 1)) {
          bVar27 = (tif->tif_flags >> 10 & 1) == 0;
          pcVar20 = "tile";
          if (bVar27) {
            pcVar20 = "strip";
          }
          uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
          if (bVar27) {
            puVar12 = puVar1;
          }
          uVar21 = (ulong)*puVar12;
          goto LAB_0029a232;
        }
        puVar23[1] = 0;
        puVar23 = puVar23 + 2;
      }
      goto LAB_00299d2f;
    }
    if (iVar26 < 1) {
      iVar26 = 0;
    }
    if (((int)puVar23 - (int)puVar7 & 4U) != 0) {
      if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) goto LAB_0029a1f4;
      *puVar23 = 0;
      puVar23 = puVar23 + 1;
    }
    if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar23) {
LAB_0029a1f4:
      bVar27 = (tif->tif_flags >> 10 & 1) == 0;
      pcVar20 = "tile";
      if (bVar27) {
        pcVar20 = "strip";
      }
      uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
      if (bVar27) {
        puVar12 = puVar1;
      }
LAB_0029a221:
      uVar22 = *puVar12;
LAB_0029a224:
      uVar21 = (ulong)uVar22;
      goto LAB_0029a232;
    }
    *puVar23 = uVar3 - iVar26;
    puVar23 = puVar23 + 1;
  }
LAB_00299d2f:
  (**(code **)(puVar5 + 0x58))(buf,puVar7,puVar23,uVar14);
  lVar8 = *(long *)(puVar5 + 8);
  buf = buf + lVar8;
  *(int *)(puVar5 + 0x98) = *(int *)(puVar5 + 0x98) + 1;
  lVar19 = local_38 - lVar8;
  bVar27 = local_38 < lVar8;
  local_38 = lVar19;
  if (lVar19 == 0 || bVar27) goto LAB_0029a09f;
  goto LAB_0029984a;
LAB_0029a09f:
  pbVar18 = tif->tif_rawcp;
  lVar19 = tif->tif_rawcc;
  goto LAB_00299d99;
  while (puVar7 < local_68) {
LAB_0029a012:
    local_68 = local_68 + -1;
    uVar15 = (int)uVar21 - *local_68;
    uVar21 = (ulong)uVar15;
    bVar27 = (int)uVar3 < (int)uVar15;
    if ((int)uVar15 <= (int)uVar3) break;
  }
LAB_0029a0c1:
  iVar24 = (int)uVar21;
  if (iVar24 < (int)uVar3) {
    iVar25 = 0;
    if (0 < iVar24) {
      iVar25 = iVar24;
    }
    if (((int)local_68 - (int)puVar7 & 4U) == 0) {
LAB_0029a14f:
      if (local_68 < puVar7 + *(uint *)(puVar5 + 0x68)) {
        *local_68 = uVar3 - iVar25;
        local_68 = local_68 + 1;
        goto LAB_0029a175;
      }
    }
    else if (local_68 < puVar7 + *(uint *)(puVar5 + 0x68)) {
      *local_68 = 0;
      local_68 = local_68 + 1;
      goto LAB_0029a14f;
    }
LAB_0029a1b9:
    bVar27 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar20 = "tile";
    if (bVar27) {
      pcVar20 = "strip";
    }
    uVar14 = (ulong)*(uint *)(puVar5 + 0x98);
    if (bVar27) {
      puVar12 = puVar1;
    }
    uVar21 = (ulong)*puVar12;
LAB_0029a232:
    TIFFErrorExtR(tif,"Fax3Decode1D","Buffer overflow at line %u of %s %u",uVar14,pcVar20,uVar21);
  }
  else {
    if (bVar27) {
      if ((puVar7 + *(uint *)(puVar5 + 0x68) <= local_68) ||
         (*local_68 = uVar3, puVar7 + *(uint *)(puVar5 + 0x68) <= local_68 + 1)) goto LAB_0029a1b9;
      local_68[1] = 0;
      local_68 = local_68 + 2;
    }
LAB_0029a175:
    iVar25 = 0;
LAB_0029a17a:
    (**(code **)(puVar5 + 0x58))(buf,puVar7,local_68,uVar14);
    puVar5[0x4c] = '\0';
    puVar5[0x4d] = '\0';
    puVar5[0x4e] = '\0';
    puVar5[0x4f] = '\0';
    *(uint *)(puVar5 + 0x48) = uVar22;
    *(int *)(puVar5 + 0x50) = iVar25;
    tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar16));
    tif->tif_rawcp = pbVar16;
  }
  return -1;
}

Assistant:

static int Fax3Decode1D(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE(tif, sp, "Fax3Decode1D");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    thisrun = sp->curruns;
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %" PRIu32 "\n", tif->tif_row);
        fflush(stdout);
#endif
        SYNC_EOL(EOF1D);
        EXPAND1D(EOF1Da);
        (*sp->fill)(buf, thisrun, pa, lastx);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOF1D: /* premature EOF */
        CLEANUP_RUNS();
    EOF1Da: /* premature EOF */
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (-1);
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}